

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

Matcher<const_std::vector<int,_std::allocator<int>_>_&> * __thiscall
testing::PolymorphicMatcher::operator_cast_to_Matcher
          (Matcher<const_std::vector<int,_std::allocator<int>_>_&> *__return_storage_ptr__,
          PolymorphicMatcher *this)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  *puVar1 = &PTR__MonomorphicImpl_0022acc0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(puVar1 + 1),
             (vector<int,_std::allocator<int>_> *)this);
  (__return_storage_ptr__->super_MatcherBase<const_std::vector<int,_std::allocator<int>_>_&>).
  vtable_ = (VTable *)
            internal::MatcherBase<std::vector<int,std::allocator<int>>const&>::
            GetVTable<testing::internal::MatcherBase<std::vector<int,std::allocator<int>>const&>::ValuePolicy<testing::MatcherInterface<std::vector<int,std::allocator<int>>const&>const*,true>>()
            ::kVTable;
  puVar2 = (undefined4 *)operator_new(0x10);
  *puVar2 = 1;
  *(undefined8 **)(puVar2 + 2) = puVar1;
  (__return_storage_ptr__->super_MatcherBase<const_std::vector<int,_std::allocator<int>_>_&>).
  buffer_.ptr = puVar2;
  (__return_storage_ptr__->super_MatcherBase<const_std::vector<int,_std::allocator<int>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0022ad28;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<T>() const {
    return Matcher<T>(new MonomorphicImpl<const T&>(impl_));
  }